

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

int ngram_search_finish(ps_search_t *search)

{
  int iVar1;
  int local_24;
  int nfr;
  int i;
  ngram_search_t *ngs;
  ps_search_t *search_local;
  
  search[5].post = *(int *)((long)&search[3].type + 4) + search[5].post;
  if (*(char *)&search[1].name == '\0') {
    if (*(char *)((long)&search[1].name + 1) != '\0') {
      ngram_fwdflat_finish((ngram_search_t *)search);
    }
  }
  else {
    ngram_fwdtree_finish((ngram_search_t *)search);
    if (*(char *)((long)&search[1].name + 1) != '\0') {
      iVar1 = acmod_rewind(search->acmod);
      if (iVar1 < 0) {
        return -1;
      }
      ngram_fwdflat_start((ngram_search_t *)search);
      local_24 = 0;
      while (0 < search->acmod->n_feat_frame) {
        iVar1 = ngram_fwdflat_search((ngram_search_t *)search,local_24);
        if (iVar1 < 0) {
          return iVar1;
        }
        acmod_advance(search->acmod);
        local_24 = local_24 + 1;
      }
      ngram_fwdflat_finish((ngram_search_t *)search);
    }
  }
  *(undefined1 *)((long)&search[1].name + 3) = 1;
  return 0;
}

Assistant:

static int
ngram_search_finish(ps_search_t *search)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    ngs->n_tot_frame += ngs->n_frame;
    if (ngs->fwdtree) {
        ngram_fwdtree_finish(ngs);
        /* dump_bptable(ngs); */

        /* Now do fwdflat search in its entirety, if requested. */
        if (ngs->fwdflat) {
            int i;
            /* Rewind the acoustic model. */
            if (acmod_rewind(ps_search_acmod(ngs)) < 0)
                return -1;
            /* Now redo search. */
            ngram_fwdflat_start(ngs);
            i = 0;
            while (ps_search_acmod(ngs)->n_feat_frame > 0) {
                int nfr;
                if ((nfr = ngram_fwdflat_search(ngs, i)) < 0)
                    return nfr;
                acmod_advance(ps_search_acmod(ngs));
                ++i;
            }
            ngram_fwdflat_finish(ngs);
            /* And now, we should have a result... */
            /* dump_bptable(ngs); */
        }
    }
    else if (ngs->fwdflat) {
        ngram_fwdflat_finish(ngs);
    }

    /* Mark the current utterance as done. */
    ngs->done = TRUE;
    return 0;
}